

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::generate_enum(t_json_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  t_enum_value *local_1a0;
  t_enum_value *val;
  t_enum_value **local_190;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_188;
  iterator val_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> values;
  string local_160;
  string local_140;
  string local_120;
  reference local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *annotation;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string local_d8;
  string local_b8;
  allocator local_91;
  string local_90;
  string local_70;
  allocator local_39;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_json_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  start_object(this,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"name",&local_39);
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_70,(string *)CONCAT44(extraout_var,iVar2));
  write_key_and_string(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = t_doc::has_doc((t_doc *)local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"doc",&local_91);
    psVar5 = t_doc::get_doc_abi_cxx11_((t_doc *)local_18);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar5);
    write_key_and_string(this,&local_90,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&(local_18->super_t_type).annotations_);
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"annotations",(allocator *)((long)&__range2 + 7));
    write_key_and(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    start_object(this,true);
    this_00 = &(local_18->super_t_type).annotations_;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_00);
    annotation = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&annotation), bVar1) {
      local_100 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_120,(string *)local_100);
      std::__cxx11::string::string((string *)&local_140,(string *)&local_100->second);
      write_key_and_string(this,&local_120,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    end_object(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"members",
             (allocator *)
             ((long)&values.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  write_key_and(this,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&values.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  start_array(this);
  __x = t_enum::get_constants(local_18);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&val_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_188);
  local_190 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&val_iter);
  local_188._M_current = local_190;
  while( true ) {
    val = (t_enum_value *)
          std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                    ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&val_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_188,
                       (__normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
                        *)&val);
    if (!bVar1) break;
    write_comma_if_needed(this);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_188);
    local_1a0 = *pptVar4;
    start_object(this,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"name",&local_1c1);
    psVar5 = t_enum_value::get_name_abi_cxx11_(local_1a0);
    std::__cxx11::string::string((string *)&local_1e8,(string *)psVar5);
    write_key_and_string(this,&local_1c0,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"value",&local_209);
    iVar2 = t_enum_value::get_value(local_1a0);
    write_key_and_integer(this,&local_208,iVar2);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    bVar1 = t_doc::has_doc(&local_1a0->super_t_doc);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_230,"doc",&local_231);
      psVar5 = t_doc::get_doc_abi_cxx11_(&local_1a0->super_t_doc);
      std::__cxx11::string::string((string *)&local_258,(string *)psVar5);
      write_key_and_string(this,&local_230,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    end_object(this);
    indicate_comma_needed(this);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_188);
  }
  end_array(this);
  end_object(this);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&val_iter);
  return;
}

Assistant:

void t_json_generator::generate_enum(t_enum* tenum) {
  start_object();

  write_key_and_string("name", tenum->get_name());

  if (tenum->has_doc()) {
    write_key_and_string("doc", tenum->get_doc());
  }

  if (tenum->annotations_.size() > 0) {
      write_key_and("annotations");
      start_object();
      for (auto & annotation : tenum->annotations_) {
        write_key_and_string(annotation.first, annotation.second);
      }
      end_object();
  }

  write_key_and("members");
  start_array();
  vector<t_enum_value*> values = tenum->get_constants();
  vector<t_enum_value*>::iterator val_iter;
  for (val_iter = values.begin(); val_iter != values.end(); ++val_iter) {
    write_comma_if_needed();
    t_enum_value* val = (*val_iter);
    start_object();
    write_key_and_string("name", val->get_name());
    write_key_and_integer("value", val->get_value());
    if (val->has_doc()) {
      write_key_and_string("doc", val->get_doc());
    }
    end_object();
    indicate_comma_needed();
  }
  end_array();

  end_object();
}